

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chain)

{
  uint uVar1;
  ON_COMPONENT_INDEX *pOVar2;
  ON_SubDEdge *local_50;
  uint local_44;
  undefined1 local_40 [4];
  uint i;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  uint count;
  ON_SimpleArray<ON_SubDEdgePtr> *edge_chain_local;
  ON_SimpleArray<ON_COMPONENT_INDEX> *edges_local;
  ON_SubD *subd_local;
  
  a.m_capacity = ON_SimpleArray<ON_COMPONENT_INDEX>::UnsignedCount(edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40,(ulong)(uint)a.m_capacity);
  for (local_44 = 0; local_44 < (uint)a.m_capacity; local_44 = local_44 + 1) {
    pOVar2 = ON_SimpleArray<ON_COMPONENT_INDEX>::operator[](edges,local_44);
    local_50 = ON_SubD::EdgeFromComponentIndex(subd,*pOVar2);
    ON_SimpleArray<const_ON_SubDEdge_*>::Append
              ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40,&local_50);
  }
  uVar1 = OrientEdgesIntoEdgeChains((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40,edge_chain);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chain
)
{
  const unsigned count = edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
    a.Append(subd.EdgeFromComponentIndex(edges[i]));
  return ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(a, edge_chain);
}